

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_acbp_v2.cpp
# Opt level: O1

void __thiscall
intel_acbp_v2_t::ibbs_body_t::ibbs_body_t
          (ibbs_body_t *this,kstream *p__io,acbp_element_t *p__parent,intel_acbp_v2_t *p__root)

{
  hash_t *phVar1;
  pointer *__ptr;
  
  (this->super_kstruct).m__io = p__io;
  (this->super_kstruct)._vptr_kstruct = (_func_int **)&PTR__ibbs_body_t_001aa6d0;
  (this->m_post_ibb_digest)._M_t.
  super___uniq_ptr_impl<intel_acbp_v2_t::hash_t,_std::default_delete<intel_acbp_v2_t::hash_t>_>._M_t
  .super__Tuple_impl<0UL,_intel_acbp_v2_t::hash_t_*,_std::default_delete<intel_acbp_v2_t::hash_t>_>.
  super__Head_base<0UL,_intel_acbp_v2_t::hash_t_*,_false>._M_head_impl = (hash_t *)0x0;
  (this->m_ibb_segments)._M_t.
  super___uniq_ptr_impl<std::vector<std::unique_ptr<intel_acbp_v2_t::ibb_segment_t,_std::default_delete<intel_acbp_v2_t::ibb_segment_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v2_t::ibb_segment_t,_std::default_delete<intel_acbp_v2_t::ibb_segment_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v2_t::ibb_segment_t,_std::default_delete<intel_acbp_v2_t::ibb_segment_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v2_t::ibb_segment_t,_std::default_delete<intel_acbp_v2_t::ibb_segment_t>_>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<std::unique_ptr<intel_acbp_v2_t::ibb_segment_t,_std::default_delete<intel_acbp_v2_t::ibb_segment_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v2_t::ibb_segment_t,_std::default_delete<intel_acbp_v2_t::ibb_segment_t>_>_>_>_*,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v2_t::ibb_segment_t,_std::default_delete<intel_acbp_v2_t::ibb_segment_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v2_t::ibb_segment_t,_std::default_delete<intel_acbp_v2_t::ibb_segment_t>_>_>_>_>_>
  .
  super__Head_base<0UL,_std::vector<std::unique_ptr<intel_acbp_v2_t::ibb_segment_t,_std::default_delete<intel_acbp_v2_t::ibb_segment_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v2_t::ibb_segment_t,_std::default_delete<intel_acbp_v2_t::ibb_segment_t>_>_>_>_*,_false>
  ._M_head_impl =
       (vector<std::unique_ptr<intel_acbp_v2_t::ibb_segment_t,_std::default_delete<intel_acbp_v2_t::ibb_segment_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v2_t::ibb_segment_t,_std::default_delete<intel_acbp_v2_t::ibb_segment_t>_>_>_>
        *)0x0;
  (this->m_ibb_digests)._M_t.
  super___uniq_ptr_impl<std::vector<std::unique_ptr<intel_acbp_v2_t::hash_t,_std::default_delete<intel_acbp_v2_t::hash_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v2_t::hash_t,_std::default_delete<intel_acbp_v2_t::hash_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v2_t::hash_t,_std::default_delete<intel_acbp_v2_t::hash_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v2_t::hash_t,_std::default_delete<intel_acbp_v2_t::hash_t>_>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<std::unique_ptr<intel_acbp_v2_t::hash_t,_std::default_delete<intel_acbp_v2_t::hash_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v2_t::hash_t,_std::default_delete<intel_acbp_v2_t::hash_t>_>_>_>_*,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v2_t::hash_t,_std::default_delete<intel_acbp_v2_t::hash_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v2_t::hash_t,_std::default_delete<intel_acbp_v2_t::hash_t>_>_>_>_>_>
  .
  super__Head_base<0UL,_std::vector<std::unique_ptr<intel_acbp_v2_t::hash_t,_std::default_delete<intel_acbp_v2_t::hash_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v2_t::hash_t,_std::default_delete<intel_acbp_v2_t::hash_t>_>_>_>_*,_false>
  ._M_head_impl =
       (vector<std::unique_ptr<intel_acbp_v2_t::hash_t,_std::default_delete<intel_acbp_v2_t::hash_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v2_t::hash_t,_std::default_delete<intel_acbp_v2_t::hash_t>_>_>_>
        *)0x0;
  (this->m_obb_digest)._M_t.
  super___uniq_ptr_impl<intel_acbp_v2_t::hash_t,_std::default_delete<intel_acbp_v2_t::hash_t>_>._M_t
  .super__Tuple_impl<0UL,_intel_acbp_v2_t::hash_t_*,_std::default_delete<intel_acbp_v2_t::hash_t>_>.
  super__Head_base<0UL,_intel_acbp_v2_t::hash_t_*,_false>._M_head_impl = (hash_t *)0x0;
  (this->m_reserved2)._M_t.
  super___uniq_ptr_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_false>.
  _M_head_impl = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
  this->m__parent = p__parent;
  this->m__root = p__root;
  std::
  __uniq_ptr_impl<std::vector<std::unique_ptr<intel_acbp_v2_t::hash_t,_std::default_delete<intel_acbp_v2_t::hash_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v2_t::hash_t,_std::default_delete<intel_acbp_v2_t::hash_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v2_t::hash_t,_std::default_delete<intel_acbp_v2_t::hash_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v2_t::hash_t,_std::default_delete<intel_acbp_v2_t::hash_t>_>_>_>_>_>
  ::reset((__uniq_ptr_impl<std::vector<std::unique_ptr<intel_acbp_v2_t::hash_t,_std::default_delete<intel_acbp_v2_t::hash_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v2_t::hash_t,_std::default_delete<intel_acbp_v2_t::hash_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v2_t::hash_t,_std::default_delete<intel_acbp_v2_t::hash_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v2_t::hash_t,_std::default_delete<intel_acbp_v2_t::hash_t>_>_>_>_>_>
           *)&this->m_ibb_digests,(pointer)0x0);
  phVar1 = (this->m_obb_digest)._M_t.
           super___uniq_ptr_impl<intel_acbp_v2_t::hash_t,_std::default_delete<intel_acbp_v2_t::hash_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_intel_acbp_v2_t::hash_t_*,_std::default_delete<intel_acbp_v2_t::hash_t>_>
           .super__Head_base<0UL,_intel_acbp_v2_t::hash_t_*,_false>._M_head_impl;
  (this->m_obb_digest)._M_t.
  super___uniq_ptr_impl<intel_acbp_v2_t::hash_t,_std::default_delete<intel_acbp_v2_t::hash_t>_>._M_t
  .super__Tuple_impl<0UL,_intel_acbp_v2_t::hash_t_*,_std::default_delete<intel_acbp_v2_t::hash_t>_>.
  super__Head_base<0UL,_intel_acbp_v2_t::hash_t_*,_false>._M_head_impl = (hash_t *)0x0;
  if (phVar1 != (hash_t *)0x0) {
    (**(code **)((long)(phVar1->super_kstruct)._vptr_kstruct + 8))();
  }
  std::
  __uniq_ptr_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::reset((__uniq_ptr_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           *)&this->m_reserved2,(pointer)0x0);
  std::
  __uniq_ptr_impl<std::vector<std::unique_ptr<intel_acbp_v2_t::ibb_segment_t,_std::default_delete<intel_acbp_v2_t::ibb_segment_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v2_t::ibb_segment_t,_std::default_delete<intel_acbp_v2_t::ibb_segment_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v2_t::ibb_segment_t,_std::default_delete<intel_acbp_v2_t::ibb_segment_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v2_t::ibb_segment_t,_std::default_delete<intel_acbp_v2_t::ibb_segment_t>_>_>_>_>_>
  ::reset((__uniq_ptr_impl<std::vector<std::unique_ptr<intel_acbp_v2_t::ibb_segment_t,_std::default_delete<intel_acbp_v2_t::ibb_segment_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v2_t::ibb_segment_t,_std::default_delete<intel_acbp_v2_t::ibb_segment_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v2_t::ibb_segment_t,_std::default_delete<intel_acbp_v2_t::ibb_segment_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v2_t::ibb_segment_t,_std::default_delete<intel_acbp_v2_t::ibb_segment_t>_>_>_>_>_>
           *)&this->m_ibb_segments,(pointer)0x0);
  _read(this);
  return;
}

Assistant:

intel_acbp_v2_t::ibbs_body_t::ibbs_body_t(kaitai::kstream* p__io, intel_acbp_v2_t::acbp_element_t* p__parent, intel_acbp_v2_t* p__root) : kaitai::kstruct(p__io) {
    m__parent = p__parent;
    m__root = p__root;
    m_post_ibb_digest = nullptr;
    m_ibb_digests = nullptr;
    m_obb_digest = nullptr;
    m_reserved2 = nullptr;
    m_ibb_segments = nullptr;
    _read();
}